

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O2

csc * triplet_to_csr(csc *T,c_int *TtoC)

{
  size_t __nmemb;
  c_int *pcVar1;
  c_int *pcVar2;
  c_float *pcVar3;
  c_int *p;
  c_int *pcVar4;
  c_float *pcVar5;
  long lVar6;
  long lVar7;
  c_int cVar8;
  csc *pcVar9;
  c_int *c;
  long lVar10;
  c_int cVar11;
  
  __nmemb = T->m;
  pcVar1 = T->i;
  pcVar2 = T->p;
  pcVar3 = T->x;
  cVar11 = T->nz;
  pcVar9 = csc_spalloc(__nmemb,T->n,cVar11,(ulong)(pcVar3 != (c_float *)0x0),0);
  c = (c_int *)calloc(__nmemb,8);
  if (pcVar9 == (csc *)0x0 || c == (c_int *)0x0) {
    cVar11 = 0;
  }
  else {
    p = pcVar9->p;
    pcVar4 = pcVar9->i;
    pcVar5 = pcVar9->x;
    lVar10 = 0;
    if (cVar11 < 1) {
      cVar11 = lVar10;
    }
    for (; cVar11 != lVar10; lVar10 = lVar10 + 1) {
      c[pcVar1[lVar10]] = c[pcVar1[lVar10]] + 1;
    }
    csc_cumsum(p,c,__nmemb);
    for (lVar10 = 0; cVar11 != lVar10; lVar10 = lVar10 + 1) {
      lVar6 = pcVar1[lVar10];
      lVar7 = c[lVar6];
      cVar8 = pcVar2[lVar10];
      c[lVar6] = lVar7 + 1;
      pcVar4[lVar7] = cVar8;
      if ((pcVar5 != (c_float *)0x0) && (pcVar5[lVar7] = pcVar3[lVar10], TtoC != (c_int *)0x0)) {
        TtoC[lVar10] = lVar7;
      }
    }
    cVar11 = 1;
  }
  pcVar9 = csc_done(pcVar9,c,(void *)0x0,cVar11);
  return pcVar9;
}

Assistant:

csc* triplet_to_csr(const csc *T, c_int *TtoC) {
  c_int m, n, nz, p, k, *Cp, *Cj, *w, *Ti, *Tj;
  c_float *Cx, *Tx;
  csc     *C;

  m  = T->m;
  n  = T->n;
  Ti = T->i;
  Tj = T->p;
  Tx = T->x;
  nz = T->nz;
  C  = csc_spalloc(m, n, nz, Tx != OSQP_NULL, 0);     /* allocate result */
  w  = csc_calloc(m, sizeof(c_int));                  /* get workspace */

  if (!C || !w) return csc_done(C, w, OSQP_NULL, 0);  /* out of memory */

  Cp = C->p;
  Cj = C->i;
  Cx = C->x;

  for (k = 0; k < nz; k++) w[Ti[k]]++;  /* row counts */
  csc_cumsum(Cp, w, m);                 /* row pointers */

  for (k = 0; k < nz; k++) {
    Cj[p = w[Ti[k]]++] = Tj[k];         /* A(i,j) is the pth entry in C */

    if (Cx) {
      Cx[p] = Tx[k];

      if (TtoC != OSQP_NULL) TtoC[k] = p;  // Assign vector of indices
    }
  }
  return csc_done(C, w, OSQP_NULL, 1);     /* success; free w and return C */
}